

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O1

Fraig_Node_t * Fraig_NodeCreatePi(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *pFVar1;
  int iVar2;
  uint uVar3;
  Fraig_Node_t *Entry;
  uint *puVar4;
  Fraig_Node_t *pFVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_38;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  puVar4 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = puVar4;
  iVar2 = p->nWordsRand;
  Entry->puSimD = puVar4 + iVar2;
  memset(puVar4 + iVar2,0,(long)p->nWordsDyna << 2);
  pFVar1 = p->vNodes;
  Entry->Num = pFVar1->nSize;
  Fraig_NodeVecPush(pFVar1,Entry);
  pFVar1 = p->vInputs;
  Entry->NumPi = pFVar1->nSize;
  Fraig_NodeVecPush(pFVar1,Entry);
  Entry->Level = 0;
  Entry->nRefs = 1;
  Entry->field_0x18 = Entry->field_0x18 & 0xfe;
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Entry->uHashR = 0;
  iVar2 = p->nWordsRand;
  if (0 < iVar2) {
    lVar7 = 0;
    do {
      uVar3 = Aig_ManRandom(0);
      uVar3 = uVar3 << (lVar7 == 0);
      Entry->puSimR[lVar7] = uVar3;
      Entry->uHashR = Entry->uHashR ^ uVar3 * s_FraigPrimes[lVar7];
      lVar7 = lVar7 + 1;
      iVar2 = p->nWordsRand;
    } while (lVar7 < iVar2);
  }
  iVar2 = Fraig_BitStringCountOnes(Entry->puSimR,iVar2);
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfff | iVar2 << 0xc;
  Entry->uHashD = 0;
  if (0 < p->iWordStart) {
    lVar7 = 0;
    do {
      uVar3 = Aig_ManRandom(0);
      Entry->puSimD[lVar7] = uVar3;
      Entry->uHashD = Entry->uHashD ^ uVar3 * s_FraigPrimes[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->iWordStart);
  }
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeSims = p->timeSims + lVar7 + lVar6;
  pFVar5 = Fraig_HashTableLookupF(p,Entry);
  if (pFVar5 == (Fraig_Node_t *)0x0) {
    return Entry;
  }
  __assert_fail("pNodeRes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigNode.c"
                ,0x8f,"Fraig_Node_t *Fraig_NodeCreatePi(Fraig_Man_t *)");
}

Assistant:

Fraig_Node_t * Fraig_NodeCreatePi( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode, * pNodeRes;
    int i;
    abctime clk;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    memset( pNode->puSimD, 0, sizeof(unsigned) * p->nWordsDyna );

    // assign the number and add to the array of nodes
    pNode->Num   = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );

    // assign the PI number and add to the array of primary inputs
    pNode->NumPi = p->vInputs->nSize;   
    Fraig_NodeVecPush( p->vInputs, pNode );

    pNode->Level =  0;  // PI has 0 level
    pNode->nRefs =  1;  // it is a persistent node, which comes referenced
    pNode->fInv  =  0;  // the simulation info of the PI is not complemented

    // derive the simulation info for the new node
clk = Abc_Clock();
    // set the random simulation info for the primary input
    pNode->uHashR = 0;
    for ( i = 0; i < p->nWordsRand; i++ )
    {
        // generate the simulation info
        pNode->puSimR[i] = FRAIG_RANDOM_UNSIGNED;
        // for reasons that take very long to explain, it makes sense to have (0000000...) 
        // pattern in the set (this helps if we need to return the counter-examples)
        if ( i == 0 )
            pNode->puSimR[i] <<= 1;
        // compute the hash key
        pNode->uHashR ^= pNode->puSimR[i] * s_FraigPrimes[i];
    }
    // count the number of ones in the simulation vector
    pNode->nOnes = Fraig_BitStringCountOnes( pNode->puSimR, p->nWordsRand );

    // set the systematic simulation info for the primary input
    pNode->uHashD = 0;
    for ( i = 0; i < p->iWordStart; i++ )
    {
        // generate the simulation info
        pNode->puSimD[i] = FRAIG_RANDOM_UNSIGNED;
        // compute the hash key
        pNode->uHashD ^= pNode->puSimD[i] * s_FraigPrimes[i];
    }
p->timeSims += Abc_Clock() - clk;

    // insert it into the hash table
    pNodeRes = Fraig_HashTableLookupF( p, pNode );
    assert( pNodeRes == NULL );
    // add to the runtime of simulation
    return pNode;
}